

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam_header.c
# Opt level: O1

SAM_hdr_tag * sam_hdr_find_key(SAM_hdr *sh,SAM_hdr_type *type,char *key,SAM_hdr_tag **prev)

{
  SAM_hdr_tag_s **ppSVar1;
  SAM_hdr_tag *pSVar2;
  SAM_hdr_tag *pSVar3;
  
  if (type->tag == (SAM_hdr_tag *)0x0) {
    pSVar2 = (SAM_hdr_tag *)0x0;
  }
  else {
    pSVar2 = (SAM_hdr_tag *)0x0;
    pSVar3 = type->tag;
    do {
      if ((*pSVar3->str == *key) && (pSVar3->str[1] == key[1])) goto LAB_0012ff82;
      ppSVar1 = &pSVar3->next;
      pSVar2 = pSVar3;
      pSVar3 = *ppSVar1;
    } while (*ppSVar1 != (SAM_hdr_tag_s *)0x0);
  }
  pSVar3 = (SAM_hdr_tag *)0x0;
LAB_0012ff82:
  if (prev != (SAM_hdr_tag **)0x0) {
    *prev = pSVar2;
  }
  return pSVar3;
}

Assistant:

SAM_hdr_tag *sam_hdr_find_key(SAM_hdr *sh,
			      SAM_hdr_type *type,
			      char *key,
			      SAM_hdr_tag **prev) {
    SAM_hdr_tag *tag, *p = NULL;

    for (tag = type->tag; tag; p = tag, tag = tag->next) {
	if (tag->str[0] == key[0] && tag->str[1] == key[1]) {
	    if (prev)
		*prev = p;
	    return tag;
	}
    }

    if (prev)
	*prev = p;

    return NULL;
}